

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_early_data_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  bool bVar2;
  
  bVar2 = true;
  if (contents != (CBS *)0x0) {
    uVar1 = ssl_protocol_version(hs->ssl);
    if (0x303 < uVar1) {
      if (contents->len == 0) {
        hs->field_0x6c9 = hs->field_0x6c9 | 8;
      }
      else {
        *out_alert = '2';
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ext_early_data_parse_clienthello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL || ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  hs->early_data_offered = true;
  return true;
}